

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structure_member.cpp
# Opt level: O2

void __thiscall
r_comp::StructureMember::StructureMember
          (StructureMember *this,_Read r,string *m,string *p,Iteration i)

{
  code *pcVar1;
  long lVar2;
  ReturnType RVar3;
  undefined4 in_register_00000084;
  Iteration in_R9D;
  
  this->_read = r;
  *(string **)&this->field_0x8 = m;
  std::__cxx11::string::string((string *)&this->_class,(string *)CONCAT44(in_register_00000084,i));
  this->iteration = in_R9D;
  std::__cxx11::string::string((string *)&this->name,(string *)p);
  pcVar1 = (code *)this->_read;
  lVar2 = *(long *)&this->field_0x8;
  RVar3 = ANY;
  if (pcVar1 != Compiler::read_any || lVar2 != 0) {
    if (pcVar1 == Compiler::read_number && lVar2 == 0) {
      RVar3 = NUMBER;
    }
    else if (pcVar1 == Compiler::read_timestamp && lVar2 == 0) {
      RVar3 = TIMESTAMP;
    }
    else if (pcVar1 == Compiler::read_boolean && lVar2 == 0) {
      RVar3 = BOOLEAN;
    }
    else if (pcVar1 == Compiler::read_string && lVar2 == 0) {
      RVar3 = STRING;
    }
    else if (pcVar1 == Compiler::read_node && lVar2 == 0) {
      RVar3 = NODE_ID;
    }
    else if (pcVar1 == Compiler::read_device && lVar2 == 0) {
      RVar3 = DEVICE_ID;
    }
    else if (pcVar1 == Compiler::read_function && lVar2 == 0) {
      RVar3 = FUNCTION_ID;
    }
    else if (pcVar1 != Compiler::read_expression || lVar2 != 0) {
      if (pcVar1 == Compiler::read_set && lVar2 == 0) {
        RVar3 = SET;
      }
      else {
        if (pcVar1 != Compiler::read_class || lVar2 != 0) {
          return;
        }
        RVar3 = CLASS;
      }
    }
  }
  this->type = RVar3;
  return;
}

Assistant:

StructureMember::StructureMember(_Read r,
                                 std::string m,
                                 std::string p,
                                 Iteration i): _read(r),
    _class(std::move(p)),
    iteration(i),
    name(std::move(m))
{
    if (_read == &Compiler::read_any) {
        type = ANY;
    } else if (_read == &Compiler::read_number) {
        type = NUMBER;
    } else if (_read == &Compiler::read_timestamp) {
        type = TIMESTAMP;
    } else if (_read == &Compiler::read_boolean) {
        type = BOOLEAN;
    } else if (_read == &Compiler::read_string) {
        type = STRING;
    } else if (_read == &Compiler::read_node) {
        type = NODE_ID;
    } else if (_read == &Compiler::read_device) {
        type = DEVICE_ID;
    } else if (_read == &Compiler::read_function) {
        type = FUNCTION_ID;
    } else if (_read == &Compiler::read_expression) {
        type = ANY;
    } else if (_read == &Compiler::read_set) {
        type = ReturnType::SET;
    } else if (_read == &Compiler::read_class) {
        type = ReturnType::CLASS;
    }
}